

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

__int128 * __thiscall
calculator::ExpressionParser<__int128>::checkZero
          (__int128 *__return_storage_ptr__,ExpressionParser<__int128> *this,__int128 value)

{
  long lVar1;
  error *this_00;
  ostream *poVar2;
  long in_RDX;
  string sStack_1d8;
  string divOperators;
  ostringstream msg;
  
  if (this != (ExpressionParser<__int128> *)0x0 || in_RDX != 0) {
    return (__int128 *)this;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&divOperators,"/%",(allocator<char> *)&msg);
  lVar1 = std::__cxx11::string::find_last_of((string *)__return_storage_ptr__,(ulong)&divOperators);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  std::operator<<((ostream *)&msg,"Parser error: division by 0");
  if (lVar1 != -1) {
    poVar2 = std::operator<<((ostream *)&msg," (error token is \"");
    std::__cxx11::string::substr((ulong)&sStack_1d8,(ulong)__return_storage_ptr__);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_1d8);
    std::operator<<(poVar2,"\")");
    std::__cxx11::string::~string((string *)&sStack_1d8);
  }
  this_00 = (error *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringbuf::str();
  error::error(this_00,(string *)__return_storage_ptr__,&sStack_1d8);
  __cxa_throw(this_00,&error::typeinfo,error::~error);
}

Assistant:

T checkZero(T value) const
  {
    if (value == 0)
    {
      std::string divOperators("/%");
      std::size_t division = expr_.find_last_of(divOperators, index_ - 2);
      std::ostringstream msg;
      msg << "Parser error: division by 0";
      if (division != std::string::npos)
        msg << " (error token is \""
            << expr_.substr(division, expr_.size() - division)
            << "\")";
      throw calculator::error(expr_, msg.str());
    }
    return value;
  }